

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfileinfogatherer_p.cpp
# Opt level: O2

void QFileInfoGatherer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&)>
                      ((QtMocHelpers *)_a,(void **)updates,0,0);
    if (((!bVar1) &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QList<QString>const&)const>
                           ((QtMocHelpers *)_a,(void **)newListOfFiles,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QString_const&)const>
                          ((QtMocHelpers *)_a,(void **)nameResolved,0,2), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QFileInfoGatherer::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)directoryLoaded,0,3);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      updates((QFileInfoGatherer *)_o,(QString *)_a[1],
              (QList<std::pair<QString,_QFileInfo>_> *)_a[2]);
      return;
    case 1:
      newListOfFiles((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)_a[2]);
      return;
    case 2:
      nameResolved((QFileInfoGatherer *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 3:
      directoryLoaded((QFileInfoGatherer *)_o,(QString *)_a[1]);
      return;
    case 4:
      list((QFileInfoGatherer *)_o,(QString *)_a[1]);
      return;
    case 5:
      fetchExtendedInformation((QFileInfoGatherer *)_o,(QString *)_a[1],(QStringList *)_a[2]);
      return;
    case 6:
      updateFile((QFileInfoGatherer *)_o,(QString *)_a[1]);
      return;
    case 8:
      *(undefined8 *)(_o + 0x58) = *_a[1];
      break;
    case 9:
      driveAdded((QFileInfoGatherer *)_o);
      return;
    case 10:
      driveRemoved((QFileInfoGatherer *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QFileInfoGatherer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileInfoGatherer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<std::pair<QString,QFileInfo>>>>(_a[2]))); break;
        case 1: _t->newListOfFiles((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 2: _t->nameResolved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->list((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->fetchExtendedInformation((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 6: _t->updateFile((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->setResolveSymlinks((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setIconProvider((*reinterpret_cast< std::add_pointer_t<QAbstractFileIconProvider*>>(_a[1]))); break;
        case 9: _t->driveAdded(); break;
        case 10: _t->driveRemoved(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QList<std::pair<QString,QFileInfo>> & )>(_a, &QFileInfoGatherer::updates, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QStringList & ) const>(_a, &QFileInfoGatherer::newListOfFiles, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QString & ) const>(_a, &QFileInfoGatherer::nameResolved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & )>(_a, &QFileInfoGatherer::directoryLoaded, 3))
            return;
    }
}